

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.h
# Opt level: O0

cmCommand * __thiscall cmIncludeDirectoryCommand::Clone(cmIncludeDirectoryCommand *this)

{
  cmCommand *this_00;
  cmIncludeDirectoryCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmIncludeDirectoryCommand((cmIncludeDirectoryCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmIncludeDirectoryCommand; }